

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

bool __thiscall t_rs_generator::can_generate_simple_const(t_rs_generator *this,t_type *ttype)

{
  int iVar1;
  t_type *ptVar2;
  t_base_type *tbase_type;
  bool bVar3;
  
  ptVar2 = t_type::get_true_type(ttype);
  iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
  if ((char)iVar1 == '\0') {
    bVar3 = false;
  }
  else {
    bVar3 = *(int *)&ptVar2[1].super_t_doc._vptr_t_doc != 7;
  }
  return bVar3;
}

Assistant:

bool t_rs_generator::can_generate_simple_const(t_type* ttype) {
  t_type* actual_type = get_true_type(ttype);
  if (actual_type->is_base_type()) {
    t_base_type* tbase_type = (t_base_type*)actual_type;
    return !(tbase_type->get_base() == t_base_type::TYPE_DOUBLE);
  } else {
    return false;
  }
}